

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

void __thiscall NTrodeObj::~NTrodeObj(NTrodeObj *this)

{
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__NTrodeObj_0043ad78;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&this->id);
  return;
}

Assistant:

NTrodeObj::~NTrodeObj() {

}